

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O0

void Search::number_to_natural(size_t big,char *c)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  char *in_RSI;
  ulong in_RDI;
  
  if (in_RDI < 10000000000) {
    if (in_RDI < 10000000) {
      if (in_RDI < 10000) {
        sprintf(in_RSI,"%d",in_RDI & 0xffffffff);
      }
      else {
        auVar3._8_8_ = 0;
        auVar3._0_8_ = in_RDI;
        sprintf(in_RSI,"%dk",(ulong)SUB164(auVar3 / ZEXT816(1000),0));
      }
    }
    else {
      auVar2._8_8_ = 0;
      auVar2._0_8_ = in_RDI;
      sprintf(in_RSI,"%dm",(ulong)SUB164(auVar2 / ZEXT816(1000000),0));
    }
  }
  else {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = in_RDI;
    sprintf(in_RSI,"%dg",(ulong)SUB164(auVar1 / ZEXT816(1000000000),0));
  }
  return;
}

Assistant:

void number_to_natural(size_t big, char* c)
{
  if (big > 9999999999)
    sprintf(c, "%dg", (int)(big / 1000000000));
  else if (big > 9999999)
    sprintf(c, "%dm", (int)(big / 1000000));
  else if (big > 9999)
    sprintf(c, "%dk", (int)(big / 1000));
  else
    sprintf(c, "%d", (int)(big));
}